

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-errno.c
# Opt level: O1

void coda_set_error_message_vargs(char *message,__va_list_tag *ap)

{
  long *in_FS_OFFSET;
  char message_buffer [4097];
  char acStack_1018 [4096];
  undefined1 local_18;
  
  if (message != (char *)0x0) {
    vsnprintf(acStack_1018,0x1000,message,ap);
    local_18 = 0;
    strcpy((char *)(*in_FS_OFFSET + -0x11d0),acStack_1018);
    return;
  }
  *(undefined1 *)(in_FS_OFFSET + -0x23a) = 0;
  return;
}

Assistant:

void coda_set_error_message_vargs(const char *message, va_list ap)
{
    if (message == NULL)
    {
        coda_error_message_buffer[0] = '\0';
    }
    else
    {
        char message_buffer[MAX_ERROR_INFO_LENGTH + 1];

        /* write to local buffer first in order to allow using the result of coda_errno_to_string inside the va_list */
        vsnprintf(message_buffer, MAX_ERROR_INFO_LENGTH, message, ap);
        message_buffer[MAX_ERROR_INFO_LENGTH] = '\0';
        strcpy(coda_error_message_buffer, message_buffer);
    }
}